

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O2

bool __thiscall DiskTableNode::mightIn(DiskTableNode *this,longlong key)

{
  bool bVar1;
  SSTableHeader *pSVar2;
  Filter *this_00;
  longlong local_20;
  
  local_20 = key;
  pSVar2 = getHeader(this);
  this_00 = getFilter(this);
  if ((key < pSVar2->key_min) || (pSVar2->key_max < key)) {
    bVar1 = false;
  }
  else {
    bVar1 = BloomFilter<long_long>::find(this_00,&local_20);
  }
  return bVar1;
}

Assistant:

bool DiskTableNode::mightIn(long long key) {
    auto *h = getHeader();
    auto *f = getFilter();
    return key >= h->key_min && key <= h->key_max && f->find(key);
}